

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::SetState(AActor *this,FState *newstate,bool nofunction)

{
  ushort uVar1;
  player_t *ppVar2;
  char *pcVar3;
  FState *pFVar4;
  bool bVar5;
  undefined8 *puVar6;
  bool bVar7;
  int iVar8;
  PClassActor *pPVar9;
  undefined4 extraout_var;
  undefined8 *puVar10;
  int32_t iVar11;
  FState *returned_state;
  FStateParamInfo stp;
  FState *local_48;
  FStateParamInfo local_40;
  
  if (((debugfile != (FILE *)0x0) && (ppVar2 = this->player, ppVar2 != (player_t *)0x0)) &&
     ((ppVar2->cheats & 0x2000) != 0)) {
    fprintf((FILE *)debugfile,"for pl %td: SetState while predicting!\n",
            ((long)&ppVar2[-0x91ab].ConversationNPCAngle >> 5) * -0x30c30c30c30c30c3);
  }
  do {
    if (newstate == (FState *)0x0) {
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      return false;
    }
    if (this->state == (FState *)0x0) {
      iVar11 = -1;
    }
    else {
      iVar11 = this->state->sprite;
    }
    if ((newstate->UseFlags & 1) == 0) {
      pPVar9 = FState::StaticFindStateOwner(newstate);
      pcVar3 = FName::NameData.NameArray
               [(pPVar9->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                Index].Text;
      pFVar4 = pPVar9->OwnedStates;
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar8);
      }
      Printf("\x1cGState %s.%d in %s not flagged for use as an actor sprite\n",pcVar3,
             (ulong)(uint)((int)((ulong)((long)newstate - (long)pFVar4) >> 3) * -0x33333333),
             FName::NameData.NameArray
             [(((this->super_DThinker).super_DObject.Class)->super_PNativeStruct).super_PStruct.
              super_PNamedType.TypeName.Index].Text);
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      iVar8 = 1;
    }
    else {
      this->state = newstate;
      iVar8 = GetTics(this,newstate);
      this->tics = iVar8;
      uVar1 = newstate->StateFlags;
      (this->renderflags).Value = ((this->renderflags).Value & 0xffffffef) + (uVar1 & 4) * 4;
      iVar8 = newstate->sprite;
      if (iVar8 != 1) {
        if ((uVar1 & 0x10) == 0) {
          this->frame = newstate->Frame;
        }
        if (iVar8 != 2) {
          if ((((this->flags4).Value & 0x20) == 0) && (iVar8 == this->SpawnState->sprite)) {
            ppVar2 = this->player;
            if (skins == (FPlayerSkin *)0x0 || ppVar2 == (player_t *)0x0) {
              if (iVar8 == iVar11) goto LAB_0041eee0;
            }
            else {
              puVar6 = (undefined8 *)
                       ((long)&((ppVar2->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                               .Nodes)->Next +
                       (ulong)(((ppVar2->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                .Size - 1 & 0x208) * 0x18));
              do {
                puVar10 = puVar6;
                puVar6 = (undefined8 *)*puVar10;
              } while (*(int *)(puVar10 + 1) != 0x208);
              iVar8 = skins[*(int *)(puVar10[2] + 0x28)].sprite;
            }
          }
          this->sprite = iVar8;
        }
      }
LAB_0041eee0:
      if (!nofunction) {
        local_40.mStateType = STATE_Actor;
        local_40.mPSPIndex = 1;
        local_40.mCallingState = newstate;
        bVar7 = FState::CallAction(newstate,this,this,&local_40,&local_48);
        iVar8 = 0;
        bVar5 = true;
        if (bVar7) {
          iVar8 = 0;
          if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            if (local_48 != (FState *)0x0) {
              this->tics = 0;
              iVar8 = 3;
              bVar5 = false;
              newstate = local_48;
            }
          }
          else {
            iVar8 = 1;
            bVar5 = false;
          }
        }
        if (!bVar5) goto LAB_0041ef4e;
      }
      newstate = newstate->NextState;
      iVar8 = 0;
    }
LAB_0041ef4e:
    if (iVar8 == 1) {
      return false;
    }
    if (this->tics != 0) {
      if (Renderer != (FRenderer *)0x0) {
        (*Renderer->_vptr_FRenderer[8])(Renderer,this);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool AActor::SetState (FState *newstate, bool nofunction)
{
	if (debugfile && player && (player->cheats & CF_PREDICTING))
		fprintf (debugfile, "for pl %td: SetState while predicting!\n", player-players);
	do
	{
		if (newstate == NULL)
		{
			state = NULL;
			Destroy ();
			return false;
		}
		int prevsprite, newsprite;

		if (state != NULL)
		{
			prevsprite = state->sprite;
		}
		else
		{
			prevsprite = -1;
		}
		if (!(newstate->UseFlags & SUF_ACTOR))
		{
			auto so = FState::StaticFindStateOwner(newstate);
			Printf(TEXTCOLOR_RED "State %s.%d in %s not flagged for use as an actor sprite\n", so->TypeName.GetChars(), int(newstate - so->OwnedStates), GetClass()->TypeName.GetChars());
			state = nullptr;
			Destroy();
			return false;
		}
		state = newstate;
		tics = GetTics(newstate);
		renderflags = (renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (newstate->GetFullbright());
		newsprite = newstate->sprite;
		if (newsprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				frame = newstate->GetFrame();
			}
			if (newsprite != SPR_NOCHANGE)
			{ // okay to change sprite
				if (!(flags4 & MF4_NOSKIN) && newsprite == SpawnState->sprite)
				{ // [RH] If the new sprite is the same as the original sprite, and
				// this actor is attached to a player, use the player's skin's
				// sprite. If a player is not attached, do not change the sprite
				// unless it is different from the previous state's sprite; a
				// player may have been attached, died, and respawned elsewhere,
				// and we do not want to lose the skin on the body. If it wasn't
				// for Dehacked, I would move sprite changing out of the states
				// altogether, since actors rarely change their sprites after
				// spawning.
					if (player != NULL && skins != NULL)
					{
						sprite = skins[player->userinfo.GetSkin()].sprite;
					}
					else if (newsprite != prevsprite)
					{
						sprite = newsprite;
					}
				}
				else
				{
					sprite = newsprite;
				}
			}
		}

		if (!nofunction)
		{
			FState *returned_state;
			FStateParamInfo stp = { newstate, STATE_Actor, PSP_WEAPON };
			if (newstate->CallAction(this, this, &stp, &returned_state))
			{
				// Check whether the called action function resulted in destroying the actor
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return false;
				}
				if (returned_state != NULL)
				{ // The action was an A_Jump-style function that wants to change the next state.
					newstate = returned_state;
					tics = 0;		 // make sure we loop and set the new state properly
					continue;
				}
			}
		}
		newstate = newstate->GetNextState();
	} while (tics == 0);

	if (Renderer != NULL)
	{
		Renderer->StateChanged(this);
	}
	return true;
}